

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSender.cpp
# Opt level: O2

void __thiscall MyServerConnection::StartSending(MyServerConnection *this)

{
  ostringstream *poVar1;
  TonkFile file;
  OutputWorker *pOVar2;
  string *psVar3;
  LogStringBuffer local_1a0;
  
  file = tonk_file_from_disk((this->super_SDKConnection).MyConnection,0x96,
                             (this->Server->FileSendName)._M_dataplus._M_p,
                             (this->Server->FileSendPath)._M_dataplus._M_p);
  this->File = file;
  psVar3 = &this->Server->FileSendPath;
  if (file == (TonkFile)0x0) {
    if ((int)Logger.ChannelMinLevel < 5) {
      poVar1 = &local_1a0.LogStream;
      local_1a0.ChannelName = Logger.ChannelName;
      local_1a0.LogLevel = Error;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,(string *)&Logger.Prefix);
      std::operator<<((ostream *)poVar1,"Failed to map source file ");
      std::operator<<((ostream *)poVar1,(string *)psVar3);
      pOVar2 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar2,&local_1a0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    }
  }
  else {
    if ((int)Logger.ChannelMinLevel < 2) {
      poVar1 = &local_1a0.LogStream;
      local_1a0.ChannelName = Logger.ChannelName;
      local_1a0.LogLevel = Debug;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,(string *)&Logger.Prefix);
      std::operator<<((ostream *)poVar1,"Successfully mapped ");
      std::operator<<((ostream *)poVar1,(string *)psVar3);
      std::operator<<((ostream *)poVar1," for file data");
      pOVar2 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar2,&local_1a0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      file = this->File;
    }
    tonk_file_send(file);
  }
  return;
}

Assistant:

void MyServerConnection::StartSending()
{
    File = tonk_file_from_disk(
        GetRawConnection(),
        TonkChannel_LowPri0,
        Server->FileSendName.c_str(),
        Server->FileSendPath.c_str());

    if (File == nullptr) {
        Logger.Error("Failed to map source file ", Server->FileSendPath);
        return;
    }

    Logger.Debug("Successfully mapped ", Server->FileSendPath, " for file data");

    tonk_file_send(File);
}